

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O1

ptr<resp_msg> __thiscall nuraft::raft_server::handle_add_srv_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  uint uVar2;
  pointer psVar3;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  int iVar6;
  uint *puVar7;
  _Alloc_hider _Var8;
  peer *ppVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  element_type *peVar13;
  buffer *buf;
  uint64_t uVar14;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _func_int *p_Var17;
  _func_int *p_Var18;
  ulong uVar19;
  bool bVar20;
  ptr<resp_msg> pVar21;
  ptr<raft_params> pVar22;
  undefined1 auVar23 [16];
  executor exec;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  undefined1 local_59;
  uint *local_58;
  _Alloc_hider _Stack_50;
  peer *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  p_Var17 = req[9].super_msg_base._vptr_msg_base[1];
  this->_vptr_raft_server = (_func_int **)0x0;
  peVar13 = (element_type *)operator_new(0xb0);
  (peVar13->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar13->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c4200;
  uVar1 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = *(uint *)((long)&req->commit_idx_ + 4);
  _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar2;
  (peVar13->bg_commit_thread_)._M_id._M_thread = (native_handle_type)p_Var17;
  *(undefined4 *)&(peVar13->bg_append_thread_)._M_id._M_thread = 7;
  *(undefined4 *)((long)&(peVar13->bg_append_thread_)._M_id._M_thread + 4) = uVar1;
  *(uint *)&peVar13->bg_append_ea_ = uVar2;
  (peVar13->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_005c4250;
  (peVar13->priority_change_timer_).t_created_.__d.__r = 0;
  (peVar13->priority_change_timer_).duration_us_ = 0;
  *(undefined8 *)&(peVar13->priority_change_timer_).first_event_fired_ = 0;
  (peVar13->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(peVar13->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)((long)&(peVar13->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)((long)&(peVar13->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18)
       = 0;
  *(undefined8 *)((long)&(peVar13->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20)
       = 0;
  peVar13->votes_responded_ = 0;
  peVar13->votes_granted_ = 0;
  (peVar13->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar13->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar13->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined4 *)&(peVar13->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar13->initialized_ = (__atomic_base<bool>)0x0;
  *(undefined3 *)&peVar13->field_0x31 = 0;
  peVar13->leader_ = (__atomic_base<int>)0x0;
  peVar13->id_ = 0;
  peVar13->my_priority_ = 0;
  *(undefined1 *)&peVar13->target_priority_ = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar13;
  this->_vptr_raft_server =
       (_func_int **)
       &(peVar13->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if ((*(long *)(in_RDX + 0x40) - (long)*(long **)(in_RDX + 0x38) != 0x10) ||
     (*(char *)(**(long **)(in_RDX + 0x38) + 8) != '\x03')) {
    psVar3 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar3 != (pointer)0x0) &&
       (iVar11 = (*(code *)(psVar3->
                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)(), _Var16._M_pi = extraout_RDX_02, 4 < iVar11)) {
      psVar3 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_
                ((string *)&local_88,
                 "bad add server request as we are expecting one log entry with value type of ClusterServer"
                );
      (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar3,5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                        ,"handle_add_srv_req",0x30,&local_88);
      _Var16._M_pi = extraout_RDX_03;
      if ((code **)local_88._M_unused._0_8_ != &local_78) {
        operator_delete(local_88._M_unused._M_object);
        _Var16._M_pi = extraout_RDX_04;
      }
    }
    *(undefined4 *)&(peVar13->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0xfffffffc
    ;
    goto LAB_0019d1d7;
  }
  if ((*(int *)&req[8].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != 3) ||
     (((ulong)req[3].super_msg_base._vptr_msg_base & 1) != 0)) {
    psVar3 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar3 != (pointer)0x0) &&
       (iVar11 = (*(code *)(psVar3->
                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)(), _Var16._M_pi = extraout_RDX, 1 < iVar11)) {
      psVar3 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_
                ((string *)&local_88,"this is not a leader, cannot handle AddServerRequest");
      (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar3,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                        ,"handle_add_srv_req",0x36,&local_88);
      _Var16._M_pi = extraout_RDX_00;
      if ((code **)local_88._M_unused._0_8_ != &local_78) {
        operator_delete(local_88._M_unused._M_object);
        _Var16._M_pi = extraout_RDX_01;
      }
    }
    *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffffd;
    goto LAB_0019d1d7;
  }
  check_srv_to_leave_timeout((raft_server *)req);
  buf = log_entry::get_buf((log_entry *)**(undefined8 **)(in_RDX + 0x38));
  srv_config::deserialize((srv_config *)&local_58,buf);
  uVar2 = *local_58;
  uVar19 = req[6].super_msg_base.term_;
  p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)(long)(int)uVar2 % uVar19);
  p_Var17 = req[6].super_msg_base._vptr_msg_base[(long)p_Var15];
  _Var16._M_pi = p_Var15;
  p_Var18 = (_func_int *)0x0;
  if ((p_Var17 != (_func_int *)0x0) &&
     (p_Var4 = *(_func_int **)p_Var17, p_Var18 = p_Var17,
     uVar2 != *(uint *)(*(_func_int **)p_Var17 + 8))) {
    while (p_Var17 = p_Var4, p_Var4 = *(_func_int **)p_Var17, p_Var4 != (_func_int *)0x0) {
      _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((ulong)(long)(int)*(uint *)(p_Var4 + 8) % uVar19);
      p_Var18 = (_func_int *)0x0;
      if ((_Var16._M_pi != p_Var15) || (p_Var18 = p_Var17, uVar2 == *(uint *)(p_Var4 + 8)))
      goto LAB_0019d272;
    }
    p_Var18 = (_func_int *)0x0;
  }
LAB_0019d272:
  if (p_Var18 == (_func_int *)0x0) {
    bVar20 = false;
  }
  else {
    bVar20 = *(long *)p_Var18 != 0;
  }
  if ((bVar20) ||
     (*(uint *)&(req->log_entries_).
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_start == uVar2)) {
    psVar3 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar3 != (pointer)0x0) &&
       (iVar11 = (*(code *)(psVar3->
                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)(), _Var16._M_pi = extraout_RDX_08, 2 < iVar11)) {
      psVar3 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_
                ((string *)&local_88,
                 "the server to be added has a duplicated id with existing server %d",
                 (ulong)*local_58);
      (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar3,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                        ,"handle_add_srv_req",0x43,&local_88);
      _Var16._M_pi = extraout_RDX_09;
      if ((code **)local_88._M_unused._0_8_ != &local_78) {
        operator_delete(local_88._M_unused._M_object);
        _Var16._M_pi = extraout_RDX_10;
      }
    }
    *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffffb;
  }
  else if (*(char *)((long)&req[2].log_entries_.
                            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) == '\x01') {
    psVar3 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar3 != (pointer)0x0) &&
       (iVar11 = (*(code *)(psVar3->
                           super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)(), _Var16._M_pi = extraout_RDX_05, 2 < iVar11)) {
      psVar3 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_((string *)&local_88,"previous config has not committed yet");
      (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar3,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                        ,"handle_add_srv_req",0x4a,&local_88);
      _Var16._M_pi = extraout_RDX_06;
      if ((code **)local_88._M_unused._0_8_ != &local_78) {
        operator_delete(local_88._M_unused._M_object);
        _Var16._M_pi = extraout_RDX_07;
      }
    }
    *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffffa;
  }
  else {
    if (req[0xb].commit_idx_ != 0) {
      uVar14 = timer_helper::get_us((timer_helper *)(req[0xb].commit_idx_ + 0x180));
      uVar19 = uVar14 / 1000;
      psVar3 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((psVar3 != (pointer)0x0) &&
         (iVar11 = (*(code *)(psVar3->
                             super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr[1].buff_.
                             super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                             (), 2 < iVar11)) {
        psVar3 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  ((string *)&local_88,
                   "previous adding server (%d) is in progress, last activity: %lu ms ago",
                   (ulong)**(uint **)req[0xb].commit_idx_,uVar19);
        (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar3,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_add_srv_req",0x57,&local_88);
        if ((code **)local_88._M_unused._0_8_ != &local_78) {
          operator_delete(local_88._M_unused._M_object);
        }
      }
      iVar6 = DAT_005e1990;
      pVar22 = context::get_params((context *)&local_88);
      _Var16 = pVar22.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      iVar11 = *(int *)(local_88._M_unused._M_function_pointer + 8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
        _Var16._M_pi = extraout_RDX_12;
      }
      if ((ulong)((long)iVar11 * (long)iVar6) < uVar19) {
        psVar3 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((psVar3 != (pointer)0x0) &&
           (iVar12 = (*(code *)(psVar3->
                               super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr[1].buff_.
                               super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )(), 2 < iVar12)) {
          psVar3 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          msg_if_given_abi_cxx11_
                    ((string *)&local_88,"activity timeout (last activity %lu ms ago), start over",
                     uVar19);
          (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)
                    (psVar3,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"handle_add_srv_req",0x61,&local_88);
          if ((code **)local_88._M_unused._0_8_ != &local_78) {
            operator_delete(local_88._M_unused._M_object);
          }
        }
        reset_srv_to_join((raft_server *)req);
        _Var16._M_pi = extraout_RDX_13;
      }
      else {
        *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffff9;
      }
      if (uVar19 <= (ulong)((long)iVar11 * (long)iVar6)) goto LAB_0019d39b;
    }
    _Var8._M_p = _Stack_50._M_p;
    puVar7 = local_58;
    local_58 = (uint *)0x0;
    _Stack_50._M_p = (pointer)0x0;
    p_Var15 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&req[0xc].super_msg_base.dst_;
    *(uint **)&req[0xc].super_msg_base.type_ = puVar7;
    *(pointer *)&req[0xc].super_msg_base.dst_ = _Var8._M_p;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
    }
    local_78 = (code *)0x0;
    pcStack_70 = (code *)0x0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88._M_unused._M_object = operator_new(0x18);
    *(code **)local_88._M_unused._0_8_ = handle_hb_timeout;
    *(code **)((long)local_88._M_unused._0_8_ + 8) = (code *)0x0;
    *(req_msg **)((long)local_88._M_unused._0_8_ + 0x10) = req;
    pcStack_70 = std::
                 _Function_handler<void_(int),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>))(int)>_>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(int),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>))(int)>_>
               ::_M_manager;
    local_48 = (peer *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::peer,std::allocator<nuraft::peer>,std::shared_ptr<nuraft::srv_config>&,nuraft::context&,std::function<void(int)>&,std::shared_ptr<nuraft::logger>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_40._M_allocated_capacity,
               &local_48,(allocator<nuraft::peer> *)&local_59,
               (shared_ptr<nuraft::srv_config> *)&req[0xc].super_msg_base.type_,
               *(context **)&req[4].super_msg_base.dst_,(function<void_(int)> *)&local_88,
               (shared_ptr<nuraft::logger> *)
               &req[9].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar10 = aStack_40._M_allocated_capacity;
    ppVar9 = local_48;
    local_48 = (peer *)0x0;
    aStack_40._M_allocated_capacity = 0;
    p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              req[0xb].log_entries_.
              super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    req[0xb].commit_idx_ = (ulong)ppVar9;
    req[0xb].log_entries_.
    super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar10;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_40._M_allocated_capacity !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_40._M_allocated_capacity);
    }
    invite_srv_to_join_cluster((raft_server *)req);
    pp_Var5 = this->_vptr_raft_server;
    auVar23 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
    _Var16._M_pi = auVar23._8_8_;
    pp_Var5[4] = auVar23._0_8_;
    *(undefined1 *)(pp_Var5 + 6) = 1;
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,3);
      _Var16._M_pi = extraout_RDX_14;
    }
  }
LAB_0019d39b:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p);
    _Var16._M_pi = extraout_RDX_11;
  }
LAB_0019d1d7:
  pVar21.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var16._M_pi;
  pVar21.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar21.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_add_srv_req(req_msg& req) {
    std::vector< ptr<log_entry> >& entries = req.log_entries();
    ptr<resp_msg> resp = cs_new<resp_msg>
                         ( state_->get_term(),
                           msg_type::add_server_response,
                           id_,
                           leader_ );

    if ( entries.size() != 1 ||
         entries[0]->get_val_type() != log_val_type::cluster_server ) {
        p_db( "bad add server request as we are expecting one log entry "
              "with value type of ClusterServer" );
        resp->set_result_code(cmd_result_code::BAD_REQUEST);
        return resp;
    }

    if (role_ != srv_role::leader || write_paused_) {
        p_er("this is not a leader, cannot handle AddServerRequest");
        resp->set_result_code(cmd_result_code::NOT_LEADER);
        return resp;
    }

    // Before checking duplicate ID, confirm srv_to_leave_ is gone.
    check_srv_to_leave_timeout();
    ptr<srv_config> srv_conf =
        srv_config::deserialize( entries[0]->get_buf() );
    if ( peers_.find( srv_conf->get_id() ) != peers_.end() ||
         id_ == srv_conf->get_id() ) {
        p_wn( "the server to be added has a duplicated "
              "id with existing server %d",
              srv_conf->get_id() );
        resp->set_result_code(cmd_result_code::SERVER_ALREADY_EXISTS);
        return resp;
    }

    if (config_changing_) {
        // the previous config has not committed yet
        p_wn("previous config has not committed yet");
        resp->set_result_code(cmd_result_code::CONFIG_CHANGING);
        return resp;
    }

    if (srv_to_join_) {
        // Adding server is already in progress.

        // Check the last active time of that server.
        ulong last_active_ms = srv_to_join_->get_active_timer_us() / 1000;
        p_wn("previous adding server (%d) is in progress, "
             "last activity: %" PRIu64 " ms ago",
             srv_to_join_->get_id(),
             last_active_ms);

        if ( last_active_ms <=
                 (ulong)raft_server::raft_limits_.response_limit_ *
                 ctx_->get_params()->heart_beat_interval_ ) {
            resp->set_result_code(cmd_result_code::SERVER_IS_JOINING);
            return resp;
        }
        // Otherwise: activity timeout, reset the server.
        p_wn("activity timeout (last activity %" PRIu64 " ms ago), start over",
             last_active_ms);
        reset_srv_to_join();
    }

    conf_to_add_ = std::move(srv_conf);
    timer_task<int32>::executor exec =
        (timer_task<int32>::executor)
        std::bind( &raft_server::handle_hb_timeout,
                   this,
                   std::placeholders::_1 );
    srv_to_join_ = cs_new< peer,
                           ptr<srv_config>&,
                           context&,
                           timer_task<int32>::executor&,
                           ptr<logger>& >
                         ( conf_to_add_, *ctx_, exec, l_ );
    invite_srv_to_join_cluster();
    resp->accept(log_store_->next_slot());
    return resp;
}